

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  int *piVar1;
  int value;
  pointer pUVar2;
  FieldDescriptor *arg;
  undefined8 *puVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  LogMessage *pLVar7;
  long *plVar8;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar9;
  long lVar10;
  long lVar11;
  UnknownFieldSet intermediate_unknown_fields;
  undefined1 local_c8 [16];
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> local_b8;
  UnknownFieldSet *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  LogMessage local_68;
  
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    lVar11 = -1;
    lVar10 = 0;
    do {
      pvVar9 = unknown_fields->fields_;
      if (pvVar9 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                     *)0x0) {
        lVar6 = 0;
      }
      else {
        lVar6 = (long)(int)((ulong)((long)(pvVar9->
                                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pvVar9->
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      lVar11 = lVar11 + 1;
      if (lVar6 <= lVar11) {
        return lVar6 <= lVar11;
      }
      if (pvVar9 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                     *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                   ,0x11c);
        pLVar7 = internal::LogMessage::operator<<(&local_68,"CHECK failed: fields_ != NULL: ");
        internal::LogFinisher::operator=((LogFinisher *)local_c8,pLVar7);
        internal::LogMessage::~LogMessage(&local_68);
      }
      piVar1 = (int *)((long)&((unknown_fields->fields_->
                               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                               )._M_impl.super__Vector_impl_data._M_start)->number_ + lVar10);
      lVar10 = lVar10 + 0x10;
    } while (*piVar1 != *(int *)(innermost_field + 0x38));
    std::operator+(&local_88,"Option \"",debug_msg_name);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    pvVar9 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)(plVar8 + 2);
    if ((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
        *plVar8 == pvVar9) {
      local_b8.
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pvVar9->
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_b8.
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar8[3];
      local_c8._0_8_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)(local_c8 + 0x10);
    }
    else {
      local_b8.
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pvVar9->
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_c8._0_8_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)*plVar8;
    }
    local_c8._8_8_ = plVar8[1];
    *plVar8 = (long)pvVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_c8);
    if ((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
        local_c8._0_8_ !=
        (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
        (local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,
                      (ulong)((long)local_b8.
                                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    return lVar6 <= lVar11;
  }
  lVar10 = 0;
  lVar11 = 0;
  local_90 = unknown_fields;
  do {
    pvVar9 = unknown_fields->fields_;
    if (pvVar9 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (long)(int)((ulong)((long)(pvVar9->
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar9->
                                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    bVar4 = lVar6 <= lVar11;
    if (lVar6 <= lVar11) {
      return bVar4;
    }
    if (pvVar9 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                 ,0x11c);
      pLVar7 = internal::LogMessage::operator<<(&local_68,"CHECK failed: fields_ != NULL: ");
      internal::LogFinisher::operator=((LogFinisher *)local_c8,pLVar7);
      internal::LogMessage::~LogMessage(&local_68);
      unknown_fields = local_90;
    }
    if (*(int *)((long)&((unknown_fields->fields_->
                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                         )._M_impl.super__Vector_impl_data._M_start)->number_ + lVar10) ==
        *(int *)(*intermediate_fields_iter._M_current + 0x38)) {
      pUVar2 = (unknown_fields->fields_->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      arg = *intermediate_fields_iter._M_current;
      if (*(GoogleOnceDynamic **)(arg + 0x40) != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                  (*(GoogleOnceDynamic **)(arg + 0x40),FieldDescriptor::TypeOnceInit,arg);
      }
      value = *(int *)(arg + 0x48);
      if (value == 10) {
        if ((*(int *)((long)&pUVar2->type_ + lVar10) == 4) &&
           (bVar5 = ExamineIfOptionIsSet
                              (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                               intermediate_fields_end,innermost_field,debug_msg_name,
                               *(UnknownFieldSet **)((long)&pUVar2->data_ + lVar10)), !bVar5)) {
          return bVar4;
        }
      }
      else {
        if (value != 0xb) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_c8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1874);
          pLVar7 = internal::LogMessage::operator<<
                             ((LogMessage *)local_c8,"Invalid wire type for CPPTYPE_MESSAGE: ");
          pLVar7 = internal::LogMessage::operator<<(pLVar7,value);
          internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar7);
          internal::LogMessage::~LogMessage((LogMessage *)local_c8);
          return bVar4;
        }
        if (*(int *)((long)&pUVar2->type_ + lVar10) == 3) {
          local_c8._0_8_ =
               (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                *)0x0;
          if (*(int *)((long)&pUVar2->type_ + lVar10) != 3) {
            __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                          ,0x13d,
                          "const string &google::protobuf::UnknownField::length_delimited() const");
          }
          puVar3 = *(undefined8 **)((long)&pUVar2->data_ + lVar10);
          bVar5 = UnknownFieldSet::ParseFromArray
                            ((UnknownFieldSet *)local_c8,(void *)*puVar3,*(int *)(puVar3 + 1));
          if ((bVar5) &&
             (bVar5 = ExamineIfOptionIsSet
                                (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                                 intermediate_fields_end,innermost_field,debug_msg_name,
                                 (UnknownFieldSet *)local_c8), !bVar5)) {
            if ((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)local_c8._0_8_ ==
                (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
              return bVar4;
            }
            UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_c8);
            return bVar4;
          }
          if ((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               *)local_c8._0_8_ !=
              (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               *)0x0) {
            UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_c8);
          }
        }
      }
    }
    lVar11 = lVar11 + 1;
    lVar10 = lVar10 + 0x10;
  } while( true );
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end,
                                      innermost_field, debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end,
                                      innermost_field, debug_msg_name,
                                      unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}